

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex.cpp
# Opt level: O2

void __thiscall Vertex::Vertex(Vertex *this,double x,double y,double z)

{
  _Rb_tree_header *p_Var1;
  Vec3d local_20;
  
  (this->neighborVertexIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighborVertexIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->neighborVertexIds)._M_t._M_impl.super__Rb_tree_header;
  (this->pos).z = 0.0;
  (this->pos).x = 0.0;
  (this->pos).y = 0.0;
  (this->neighborVertexIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->neighborVertexIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->neighborVertexIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->id = -0x61;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->neighborVertexIds)._M_t);
  (this->pos).x = x;
  (this->pos).y = y;
  (this->pos).z = z;
  local_20.x = x;
  local_20.y = y;
  local_20.z = z;
  Vec3d::~Vec3d(&local_20);
  return;
}

Assistant:

Vertex::Vertex(double x,double y,double z)
{
	id = -97;
	neighborVertexIds.clear();
	pos = Vec3d(x,y,z);
}